

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

void Saig_SynchInitPisGiven(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords,char *pValues)

{
  byte bVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  iVar7 = pAig->nTruePis;
  if (0 < iVar7) {
    pVVar3 = pAig->vCis;
    lVar6 = 0;
    do {
      if (pVVar3->nSize <= lVar6) {
LAB_006f7e4a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar2 = *(int *)((long)pVVar3->pArray[lVar6] + 0x24);
      if (((long)iVar2 < 0) || (vSimInfo->nSize <= iVar2)) goto LAB_006f7e4a;
      if (0 < nWords) {
        pvVar4 = vSimInfo->pArray[iVar2];
        uVar8 = 0;
        do {
          bVar1 = pValues[lVar6];
          uVar5 = (uint)bVar1;
          if (bVar1 != 0) {
            if ((bVar1 != 1) && (bVar1 != 3)) {
              __assert_fail("v == 0 || v == 1 || v == 3",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigSynch.c"
                            ,0x37,"unsigned int Saig_SynchTernary(int)");
            }
            uVar5 = -(uint)(bVar1 != 1) | 0x55555555;
          }
          *(uint *)((long)pvVar4 + uVar8 * 4) = uVar5;
          uVar8 = uVar8 + 1;
        } while ((uint)nWords != uVar8);
        iVar7 = pAig->nTruePis;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar7);
  }
  return;
}

Assistant:

void Saig_SynchInitPisGiven( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords, char * pValues )
{
    Aig_Obj_t * pObj;
    unsigned * pSim;
    int i, w;
    Saig_ManForEachPi( pAig, pObj, i )
    {
        pSim = (unsigned *)Vec_PtrEntry( vSimInfo, pObj->Id );
        for ( w = 0; w < nWords; w++ )
            pSim[w] = Saig_SynchTernary( pValues[i] );
    }
}